

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall
testing::internal::MatcherBase<const_google::protobuf::FeatureSetDefaults_&>::~MatcherBase
          (MatcherBase<const_google::protobuf::FeatureSetDefaults_&> *this)

{
  MatcherBase<const_google::protobuf::FeatureSetDefaults_&> *this_local;
  
  ~MatcherBase(this);
  operator_delete(this,0x18);
  return;
}

Assistant:

~MatcherBase() override { Destroy(); }